

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O2

pair<std::__detail::_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>,_bool>
 __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::insert(OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *this,value_type entry)

{
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>,_bool>
  pVar1;
  
  if ((uint)entry.first.value._0_4_ < 0xd) {
    pVar1 = std::
            _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<duckdb::string_t_const,unsigned_long>>
                      ((_Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->map,&entry);
  }
  else {
    CopyString(this,entry.first.value);
    pVar1 = std::
            _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<duckdb::string_t,unsigned_long>>
                      ((_Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->map);
  }
  return pVar1;
}

Assistant:

pair<iterator, bool> insert(value_type entry) { // NOLINT: match std style
		if (entry.first.IsInlined()) {
			return map.insert(std::move(entry));
		} else {
			return map.insert(make_pair(CopyString(entry.first), std::move(entry.second)));
		}
	}